

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O2

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CEseqFloatVisitor::processRightEseqInCBinop
          (CEseqFloatVisitor *this,CBinopExpression *binop,CExpression *left,
          CEseqExpression *rightEseq)

{
  CSeqStatement *pCVar1;
  INode IVar2;
  bool bVar3;
  TOperationType TVar4;
  CStatement *pCVar5;
  CEseqExpression *this_00;
  CBinopExpression *pCVar6;
  CExpression *pCVar7;
  CMoveStatement *this_01;
  CTempExpression *pCVar8;
  CMemExpression *this_02;
  pointer *__ptr;
  CEseqExpression *in_R8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var9;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_e8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_e0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_c8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_c0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_b8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_b0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_a8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_a0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_98;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_90;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  CSeqStatement *local_68;
  INode local_60;
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_58;
  CTemp temp;
  
  local_58._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
       (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)this;
  pCVar5 = CEseqExpression::getStatement(in_R8);
  bVar3 = isExpCommuteWithStm(&rightEseq->super_CExpression,pCVar5);
  if (bVar3) {
    this_00 = (CEseqExpression *)operator_new(0x18);
    pCVar5 = CEseqExpression::getStatement(in_R8);
    (*(pCVar5->super_IStatement).super_INode._vptr_INode[3])(&temp,pCVar5);
    local_a0._M_head_impl = (CStatement *)temp.name._M_dataplus._M_p;
    temp.name._M_dataplus._M_p = (pointer)0x0;
    pCVar6 = (CBinopExpression *)operator_new(0x20);
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_e0,rightEseq);
    local_a8._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (CExpression *)0x0;
    pCVar7 = CEseqExpression::getExpression(in_R8);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_e8,pCVar7);
    local_b0._M_head_impl = local_e8._M_head_impl;
    local_e8._M_head_impl = (CExpression *)0x0;
    TVar4 = CBinopExpression::getOperation((CBinopExpression *)left);
    CBinopExpression::CBinopExpression
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_a8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_b0,TVar4);
    local_70._M_head_impl = (CExpression *)pCVar6;
    CEseqExpression::CEseqExpression
              (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_a0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70);
    _Var9._M_head_impl =
         (CExpression *)
         local_58._M_t.
         super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
         .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    *(CEseqExpression **)
     local_58._M_t.
     super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
     super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = this_00;
    if ((CBinopExpression *)local_70._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_70._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_70._M_head_impl = (CExpression *)0x0;
    if (local_b0._M_head_impl != (CExpression *)0x0) {
      (*((local_b0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_b0._M_head_impl = (CExpression *)0x0;
    if (local_e8._M_head_impl != (CExpression *)0x0) {
      (*((local_e8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_a8._M_head_impl != (CExpression *)0x0) {
      (*((local_a8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_a8._M_head_impl = (CExpression *)0x0;
    if (local_e0._M_head_impl != (CExpression *)0x0) {
      (*((local_e0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_a0._M_head_impl != (CStatement *)0x0) {
      (*((local_a0._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_a0._M_head_impl = (CStatement *)0x0;
    if (temp.name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)temp.name._M_dataplus._M_p + 0x10))();
    }
  }
  else {
    CTemp::CTemp(&temp);
    local_60._vptr_INode = (_func_int **)operator_new(0x18);
    local_68 = (CSeqStatement *)operator_new(0x18);
    this_01 = (CMoveStatement *)operator_new(0x18);
    pCVar8 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar8,&temp);
    local_c8._M_head_impl = (CExpression *)pCVar8;
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_e0,rightEseq);
    local_78._M_head_impl = local_e0._M_head_impl;
    local_e0._M_head_impl = (CExpression *)0x0;
    CMoveStatement::CMoveStatement
              (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_c8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_78);
    local_c0._M_head_impl = (CStatement *)this_01;
    pCVar5 = CEseqExpression::getStatement(in_R8);
    (*(pCVar5->super_IStatement).super_INode._vptr_INode[3])(&local_e8,pCVar5);
    pCVar1 = local_68;
    local_80._M_head_impl = (CStatement *)local_e8._M_head_impl;
    local_e8._M_head_impl = (CExpression *)0x0;
    CSeqStatement::CSeqStatement
              (local_68,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_c0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_80);
    local_b8._M_head_impl = &pCVar1->super_CStatement;
    pCVar6 = (CBinopExpression *)operator_new(0x20);
    this_02 = (CMemExpression *)operator_new(0x10);
    pCVar8 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar8,&temp);
    local_90._M_head_impl = (CExpression *)pCVar8;
    CMemExpression::CMemExpression
              (this_02,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_90);
    local_d0._M_head_impl = (CExpression *)this_02;
    pCVar7 = CEseqExpression::getExpression(in_R8);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_98,pCVar7);
    local_d8._M_head_impl = local_98._M_head_impl;
    local_98._M_head_impl = (CExpression *)0x0;
    TVar4 = CBinopExpression::getOperation((CBinopExpression *)left);
    CBinopExpression::CBinopExpression
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_d0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_d8,TVar4);
    IVar2._vptr_INode = local_60._vptr_INode;
    local_88._M_head_impl = (CExpression *)pCVar6;
    CEseqExpression::CEseqExpression
              ((CEseqExpression *)local_60._vptr_INode,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_b8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_88);
    _Var9._M_head_impl = (CExpression *)local_58;
    *(_func_int ***)
     local_58._M_t.
     super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
     super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = IVar2._vptr_INode;
    if ((CBinopExpression *)local_88._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_88._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_88._M_head_impl = (CExpression *)0x0;
    if (local_d8._M_head_impl != (CExpression *)0x0) {
      (*((local_d8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_d8._M_head_impl = (CExpression *)0x0;
    if (local_98._M_head_impl != (CExpression *)0x0) {
      (*((local_98._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if ((CMemExpression *)local_d0._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_d0._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_d0._M_head_impl = (CExpression *)0x0;
    if ((CTempExpression *)local_90._M_head_impl != (CTempExpression *)0x0) {
      (*(((CExpression *)&(local_90._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_90._M_head_impl = (CExpression *)0x0;
    if ((CSeqStatement *)local_b8._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_b8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_b8._M_head_impl = (CStatement *)0x0;
    if ((CExpression *)local_80._M_head_impl != (CExpression *)0x0) {
      (*(((IExpression *)&(local_80._M_head_impl)->super_IStatement)->super_INode)._vptr_INode[2])()
      ;
    }
    local_80._M_head_impl = (CStatement *)0x0;
    if (local_e8._M_head_impl != (CExpression *)0x0) {
      (*((local_e8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if ((CMoveStatement *)local_c0._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_c0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_c0._M_head_impl = (CStatement *)0x0;
    if (local_78._M_head_impl != (CExpression *)0x0) {
      (*((local_78._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_78._M_head_impl = (CExpression *)0x0;
    if (local_e0._M_head_impl != (CExpression *)0x0) {
      (*((local_e0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if ((CTempExpression *)local_c8._M_head_impl != (CTempExpression *)0x0) {
      (*(((CExpression *)&(local_c8._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_c8._M_head_impl = (CExpression *)0x0;
    std::__cxx11::string::~string((string *)&temp);
  }
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           _Var9._M_head_impl;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CEseqFloatVisitor::processRightEseqInCBinop(
        const IRT::CBinopExpression *binop,
        const IRT::CExpression *left, const IRT::CEseqExpression *rightEseq) {

    if (isExpCommuteWithStm(left, rightEseq->getStatement())) {
        return EMOVE_UNIQ(new CEseqExpression(
                std::move(rightEseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CBinopExpression(
                        std::move(left->Copy()),
                        std::move(rightEseq->getExpression()->Copy()),
                        binop->getOperation()
                ))
        ));
    } else {
        CTemp temp;
        return EMOVE_UNIQ(new CEseqExpression(
                SMOVE_UNIQ(new CSeqStatement(
                    SMOVE_UNIQ(new CMoveStatement(
                        EMOVE_UNIQ(new CTempExpression(temp)),
                        std::move(left->Copy())
                    )),
                    std::move(rightEseq->getStatement()->Copy())
                )),
                EMOVE_UNIQ(new CBinopExpression(
                        EMOVE_UNIQ(new CMemExpression( EMOVE_UNIQ(new CTempExpression(temp)))),
                        std::move(rightEseq->getExpression()->Copy()),
                        binop->getOperation()
                ))
        ));
    }
}